

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSendStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    iVar1 = Abc_FrameIsBridgeMode();
    if (iVar1 == 0) {
      Abc_Print(-1,"The bridge mode is not available.\n");
      pAbc_local._4_4_ = 1;
    }
    else if ((pAbc->Status == 0) && (pAbc->pCex == (Abc_Cex_t *)0x0)) {
      Abc_Print(-1,"Status is \"sat\", but current CEX is not available.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      Gia_ManToBridgeResult(_stdout,pAbc->Status,pAbc->pCex,0);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: send_status\n");
    Abc_Print(-2,"\t         sends current status to the bridge\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandSendStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManToBridgeResult( FILE * pFile, int Result, Abc_Cex_t * pCex, int iPoProved );
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_FrameIsBridgeMode() )
    {
        Abc_Print( -1, "The bridge mode is not available.\n" );
        return 1;
    }
    if ( pAbc->Status == 0 && pAbc->pCex == NULL )
    {
        Abc_Print( -1, "Status is \"sat\", but current CEX is not available.\n" );
        return 1;
    }
    Gia_ManToBridgeResult( stdout, pAbc->Status, pAbc->pCex, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: send_status\n" );
    Abc_Print( -2, "\t         sends current status to the bridge\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}